

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

int __thiscall gdscpp::genDot(gdscpp *this,string *fileName)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  char *pcVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [8];
  string bashCmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  uint local_9c;
  string local_98 [4];
  uint i_1;
  string lineStr;
  FILE *dotFile;
  uint local_60;
  int local_5c;
  uint k;
  int j;
  int i;
  bool foundSTR;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toSTR;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fromSTR;
  string *fileName_local;
  gdscpp *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Generating Dot file:\"");
  poVar3 = std::operator<<(poVar3,(string *)fileName);
  poVar3 = std::operator<<(poVar3,"\" file");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&toSTR.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i);
  k = 0;
  do {
    sVar4 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::size(&this->STR);
    if (sVar4 <= (ulong)(long)(int)k) {
      lineStr.field_2._8_8_ = fopen("foo.dot","w");
      std::__cxx11::string::string(local_98);
      std::__cxx11::string::operator=(local_98,"digraph GDStree {\n");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      fputs(pcVar8,(FILE *)lineStr.field_2._8_8_);
      local_9c = 0;
      while( true ) {
        uVar9 = (ulong)local_9c;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&toSTR.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar4 <= uVar9) break;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&toSTR.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_9c
                             );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&bashCmd.field_2 + 8),"\t",pvVar6);
        std::operator+(&local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&bashCmd.field_2 + 8)," -> ");
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&i,(ulong)local_9c);
        std::operator+(&local_e0,&local_100,pvVar6);
        std::operator+(&local_c0,&local_e0,";\n");
        std::__cxx11::string::operator=(local_98,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)(bashCmd.field_2._M_local_buf + 8));
        pcVar8 = (char *)std::__cxx11::string::c_str();
        fputs(pcVar8,(FILE *)lineStr.field_2._8_8_);
        local_9c = local_9c + 1;
      }
      std::__cxx11::string::operator=(local_98,"}");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      fputs(pcVar8,(FILE *)lineStr.field_2._8_8_);
      fclose((FILE *)lineStr.field_2._8_8_);
      poVar3 = std::operator<<((ostream *)&std::cout,"Dot file done.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::string(local_140);
      std::operator+(&local_160,"dot -Tjpg foo.dot -o ",fileName);
      std::__cxx11::string::operator=(local_140,(string *)&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      iVar2 = system(pcVar8);
      if (iVar2 == -1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Bash command :\"");
        poVar3 = std::operator<<(poVar3,local_140);
        poVar3 = std::operator<<(poVar3,"\" error.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = 1;
      }
      else {
        std::__cxx11::string::operator=(local_140,"rm foo.dot");
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iVar2 = system(pcVar8);
        if (iVar2 == -1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Bash command :\"");
          poVar3 = std::operator<<(poVar3,local_140);
          poVar3 = std::operator<<(poVar3,"\" error.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          this_local._4_4_ = 1;
        }
        else {
          this_local._4_4_ = 0;
        }
      }
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&toSTR.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return this_local._4_4_;
    }
    local_5c = 0;
    while( true ) {
      pvVar5 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)(int)k);
      sVar4 = std::vector<gdsSREF,_std::allocator<gdsSREF>_>::size(&pvVar5->SREF);
      if (sVar4 <= (ulong)(long)local_5c) break;
      bVar1 = true;
      local_60 = 0;
      while( true ) {
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&toSTR.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar4 <= local_60) break;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&toSTR.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_60
                             );
        std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)(int)k);
        iVar2 = std::__cxx11::string::compare((string *)pvVar6);
        if (iVar2 == 0) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&i,(ulong)local_60);
          pvVar5 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)(int)k)
          ;
          std::vector<gdsSREF,_std::allocator<gdsSREF>_>::operator[](&pvVar5->SREF,(long)local_5c);
          iVar2 = std::__cxx11::string::compare((string *)pvVar6);
          if (iVar2 == 0) {
            bVar1 = false;
            break;
          }
        }
        local_60 = local_60 + 1;
      }
      if (bVar1) {
        pvVar5 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)(int)k);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&toSTR.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&pvVar5->name);
        pvVar5 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)(int)k);
        pvVar7 = std::vector<gdsSREF,_std::allocator<gdsSREF>_>::operator[]
                           (&pvVar5->SREF,(long)local_5c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i,&pvVar7->name);
      }
      local_5c = local_5c + 1;
    }
    k = k + 1;
  } while( true );
}

Assistant:

int gdscpp::genDot(const std::string &fileName)
{
  cout << "Generating Dot file:\"" << fileName << "\" file" << endl;

  vector<string> fromSTR;
  vector<string> toSTR;

  bool foundSTR;
  for (int i = 0; i < this->STR.size(); i++) {
    for (int j = 0; j < this->STR[i].SREF.size(); j++) {
      foundSTR = true;
      for (unsigned int k = 0; k < fromSTR.size(); k++) {
        if (!fromSTR[k].compare(this->STR[i].name) &&
            !toSTR[k].compare(this->STR[i].SREF[j].name)) {
          foundSTR = false;
          break;
        }
      }
      if (foundSTR) {
        fromSTR.push_back(this->STR[i].name);
        toSTR.push_back(this->STR[i].SREF[j].name);
      }
    }
  }

  // ------------------------ creating dot file ------------------------

  FILE *dotFile;
  dotFile = fopen("foo.dot", "w");

  string lineStr;

  lineStr = "digraph GDStree {\n";
  fputs(lineStr.c_str(), dotFile);

  for (unsigned int i = 0; i < fromSTR.size(); i++) {
    lineStr = "\t" + fromSTR[i] + " -> " + toSTR[i] + ";\n";
    fputs(lineStr.c_str(), dotFile);
  }

  lineStr = "}";
  fputs(lineStr.c_str(), dotFile);

  fclose(dotFile);
  cout << "Dot file done." << endl;

  // ------------------------ executing dot script ------------------------
  string bashCmd;
  bashCmd = "dot -Tjpg foo.dot -o " + fileName;

  if (system(bashCmd.c_str()) == -1) {
    cout << "Bash command :\"" << bashCmd << "\" error." << endl;
    return 1;
  }

  bashCmd = "rm foo.dot";
  if (system(bashCmd.c_str()) == -1) {
    cout << "Bash command :\"" << bashCmd << "\" error." << endl;
    return 1;
  }

  return 0;
}